

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCoordinatesTests.cpp
# Opt level: O0

vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_> *
vkt::tessellation::anon_unknown_0::genTessLevelCases
          (vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
           *__return_storage_ptr__,TessPrimitiveType primitiveType,SpacingMode spacingMode)

{
  int iVar1;
  long lVar2;
  int local_68;
  int local_64;
  int j_1;
  int j;
  float *outer;
  float *inner;
  float fStack_48;
  TessLevels curTessLevelCase;
  int tessLevelCaseNdx;
  allocator<vkt::tessellation::TessLevels> local_19;
  SpacingMode local_18;
  TessPrimitiveType local_14;
  SpacingMode spacingMode_local;
  TessPrimitiveType primitiveType_local;
  vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_> *result;
  
  local_18 = spacingMode;
  local_14 = primitiveType;
  _spacingMode_local = __return_storage_ptr__;
  if (spacingMode == SPACINGMODE_EQUAL) {
    std::allocator<vkt::tessellation::TessLevels>::allocator(&local_19);
    std::vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>::
    vector<vkt::tessellation::TessLevels_const*,void>
              ((vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>
                *)__return_storage_ptr__,genTessLevelCases::rawTessLevelCases,
               (TessLevels *)&DAT_01337fb8,&local_19);
    std::allocator<vkt::tessellation::TessLevels>::~allocator(&local_19);
  }
  else {
    curTessLevelCase.outer[3]._3_1_ = 0;
    std::vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
    vector(__return_storage_ptr__);
    std::vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
    reserve(__return_storage_ptr__,9);
    for (curTessLevelCase.outer[2] = 0.0; (int)curTessLevelCase.outer[2] < 9;
        curTessLevelCase.outer[2] = (float)((int)curTessLevelCase.outer[2] + 1)) {
      lVar2 = (long)(int)curTessLevelCase.outer[2];
      unique0x00012000 = *(undefined8 *)genTessLevelCases::rawTessLevelCases[lVar2].inner;
      curTessLevelCase.inner = *(float (*) [2])genTessLevelCases::rawTessLevelCases[lVar2].outer;
      curTessLevelCase.outer._0_8_ =
           *(undefined8 *)(genTessLevelCases::rawTessLevelCases[lVar2].outer + 2);
      for (local_64 = 0; local_64 < 2; local_64 = local_64 + 1) {
        iVar1 = getClampedRoundedTessLevel
                          (local_18,*(float *)((long)&inner + (long)local_64 * 4 + 4));
        *(float *)((long)&inner + (long)local_64 * 4 + 4) = (float)iVar1;
      }
      for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
        iVar1 = getClampedRoundedTessLevel(local_18,curTessLevelCase.inner[local_68]);
        curTessLevelCase.inner[local_68] = (float)iVar1;
      }
      if (local_14 == TESSPRIMITIVETYPE_TRIANGLES) {
        if ((((1.0 < curTessLevelCase.inner[0]) || (1.0 < curTessLevelCase.inner[1])) ||
            (1.0 < curTessLevelCase.outer[0])) && ((inner._4_4_ == 1.0 && (!NAN(inner._4_4_))))) {
          iVar1 = getClampedRoundedTessLevel(local_18,inner._4_4_ + 0.1);
          inner._4_4_ = (float)iVar1;
        }
      }
      else if ((local_14 == TESSPRIMITIVETYPE_QUADS) &&
              ((((1.0 < curTessLevelCase.inner[0] || (1.0 < curTessLevelCase.inner[1])) ||
                (1.0 < curTessLevelCase.outer[0])) || (1.0 < curTessLevelCase.outer[1])))) {
        if ((inner._4_4_ == 1.0) && (!NAN(inner._4_4_))) {
          iVar1 = getClampedRoundedTessLevel(local_18,inner._4_4_ + 0.1);
          inner._4_4_ = (float)iVar1;
        }
        if ((fStack_48 == 1.0) && (!NAN(fStack_48))) {
          getClampedRoundedTessLevel(local_18,fStack_48 + 0.1);
        }
      }
      std::vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
      push_back(__return_storage_ptr__,(value_type *)((long)&inner + 4));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TessLevels> genTessLevelCases (const TessPrimitiveType	primitiveType,
										   const SpacingMode		spacingMode)
{
	static const TessLevels rawTessLevelCases[] =
	{
		{ { 1.0f,	1.0f	},	{ 1.0f,		1.0f,	1.0f,	1.0f	} },
		{ { 63.0f,	24.0f	},	{ 15.0f,	42.0f,	10.0f,	12.0f	} },
		{ { 3.0f,	2.0f	},	{ 6.0f,		8.0f,	7.0f,	9.0f	} },
		{ { 4.0f,	6.0f	},	{ 2.0f,		3.0f,	1.0f,	4.0f	} },
		{ { 2.0f,	2.0f	},	{ 6.0f,		8.0f,	7.0f,	9.0f	} },
		{ { 5.0f,	6.0f	},	{ 1.0f,		1.0f,	1.0f,	1.0f	} },
		{ { 1.0f,	6.0f	},	{ 2.0f,		3.0f,	1.0f,	4.0f	} },
		{ { 5.0f,	1.0f	},	{ 2.0f,		3.0f,	1.0f,	4.0f	} },
		{ { 5.2f,	1.6f	},	{ 2.9f,		3.4f,	1.5f,	4.1f	} }
	};

	if (spacingMode == SPACINGMODE_EQUAL)
		return std::vector<TessLevels>(DE_ARRAY_BEGIN(rawTessLevelCases), DE_ARRAY_END(rawTessLevelCases));
	else
	{
		std::vector<TessLevels> result;
		result.reserve(DE_LENGTH_OF_ARRAY(rawTessLevelCases));

		for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < DE_LENGTH_OF_ARRAY(rawTessLevelCases); ++tessLevelCaseNdx)
		{
			TessLevels curTessLevelCase = rawTessLevelCases[tessLevelCaseNdx];

			float* const inner = &curTessLevelCase.inner[0];
			float* const outer = &curTessLevelCase.outer[0];

			for (int j = 0; j < 2; ++j) inner[j] = static_cast<float>(getClampedRoundedTessLevel(spacingMode, inner[j]));
			for (int j = 0; j < 4; ++j) outer[j] = static_cast<float>(getClampedRoundedTessLevel(spacingMode, outer[j]));

			if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			{
				if (outer[0] > 1.0f || outer[1] > 1.0f || outer[2] > 1.0f)
				{
					if (inner[0] == 1.0f)
						inner[0] = static_cast<float>(getClampedRoundedTessLevel(spacingMode, inner[0] + 0.1f));
				}
			}
			else if (primitiveType == TESSPRIMITIVETYPE_QUADS)
			{
				if (outer[0] > 1.0f || outer[1] > 1.0f || outer[2] > 1.0f || outer[3] > 1.0f)
				{
					if (inner[0] == 1.0f) inner[0] = static_cast<float>(getClampedRoundedTessLevel(spacingMode, inner[0] + 0.1f));
					if (inner[1] == 1.0f) inner[1] = static_cast<float>(getClampedRoundedTessLevel(spacingMode, inner[1] + 0.1f));
				}
			}

			result.push_back(curTessLevelCase);
		}

		DE_ASSERT(static_cast<int>(result.size()) == DE_LENGTH_OF_ARRAY(rawTessLevelCases));
		return result;
	}
}